

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O0

void __thiscall
spdlog::details::level_formatter<spdlog::details::scoped_padder>::format
          (level_formatter<spdlog::details::scoped_padder> *this,log_msg *msg,tm *param_2,
          memory_buf_t *dest)

{
  size_t wrapped_size;
  memory_buf_t *dest_00;
  string_view_t view;
  undefined1 local_58 [8];
  scoped_padder p;
  string_view_t *level_name;
  memory_buf_t *dest_local;
  tm *param_2_local;
  log_msg *msg_local;
  level_formatter<spdlog::details::scoped_padder> *this_local;
  
  p.spaces_.size_ = (size_t)level::to_string_view(msg->level);
  wrapped_size = fmt::v10::basic_string_view<char>::size((basic_string_view<char> *)p.spaces_.size_)
  ;
  dest_00 = dest;
  scoped_padder::scoped_padder
            ((scoped_padder *)local_58,wrapped_size,&(this->super_flag_formatter).padinfo_,dest);
  view.size_ = (size_t)dest;
  view.data_ = *(char **)(p.spaces_.size_ + 8);
  fmt_helper::append_string_view(*(fmt_helper **)p.spaces_.size_,view,dest_00);
  scoped_padder::~scoped_padder((scoped_padder *)local_58);
  return;
}

Assistant:

void format(const details::log_msg &msg, const std::tm &, memory_buf_t &dest) override {
        const string_view_t &level_name = level::to_string_view(msg.level);
        ScopedPadder p(level_name.size(), padinfo_, dest);
        fmt_helper::append_string_view(level_name, dest);
    }